

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3PoslistMerge(char **pp,char **pp1,char **pp2)

{
  int iVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int n;
  sqlite3_int64 iPrev;
  sqlite3_int64 i2;
  sqlite3_int64 i1;
  int iCol2;
  int iCol1;
  char *p2;
  char *p1;
  char *p;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  char **in_stack_ffffffffffffffa0;
  char **pp_00;
  undefined3 uVar2;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char **in_stack_ffffffffffffffb0;
  uint local_38;
  uint local_34;
  char *local_30;
  char *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_20 = (undefined1 *)*in_RDI;
  local_28 = (char *)*in_RSI;
  local_30 = (char *)*in_RDX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    uVar2 = (undefined3)in_stack_ffffffffffffffa8;
    in_stack_ffffffffffffffa8 = CONCAT13(1,uVar2);
    if (*local_28 == '\0') {
      in_stack_ffffffffffffffa8 = CONCAT13(*local_30 != '\0',uVar2);
    }
    if ((char)((uint)in_stack_ffffffffffffffa8 >> 0x18) == '\0') {
      *local_20 = 0;
      *local_8 = local_20 + 1;
      *local_10 = local_28 + 1;
      *local_18 = local_30 + 1;
      return;
    }
    if (*local_28 == '\x01') {
      if ((local_28[1] & 0x80U) == 0) {
        local_34 = (uint)(byte)local_28[1];
      }
      else {
        sqlite3Fts3GetVarint32(local_28 + 1,(int *)&local_34);
      }
    }
    else if (*local_28 == '\0') {
      local_34 = 0x7fffffff;
    }
    else {
      local_34 = 0;
    }
    if (*local_30 == '\x01') {
      if ((local_30[1] & 0x80U) == 0) {
        local_38 = (uint)(byte)local_30[1];
      }
      else {
        sqlite3Fts3GetVarint32(local_30 + 1,(int *)&local_38);
      }
    }
    else if (*local_30 == '\0') {
      local_38 = 0x7fffffff;
    }
    else {
      local_38 = 0;
    }
    if (local_34 == local_38) break;
    if ((int)local_34 < (int)local_38) {
      iVar1 = fts3PutColNumber(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      local_28 = local_28 + iVar1;
      fts3ColumnlistCopy(in_stack_ffffffffffffffb0,
                         (char **)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    else {
      iVar1 = fts3PutColNumber(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      local_30 = local_30 + iVar1;
      fts3ColumnlistCopy(in_stack_ffffffffffffffb0,
                         (char **)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
  }
  iVar1 = fts3PutColNumber(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  local_28 = local_28 + iVar1;
  local_30 = local_30 + iVar1;
  fts3GetDeltaVarint(in_stack_ffffffffffffffa0,
                     (sqlite3_int64 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
  ;
  fts3GetDeltaVarint(in_stack_ffffffffffffffa0,
                     (sqlite3_int64 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
  ;
  do {
    pp_00 = (char **)0x0;
    fts3PutDeltaVarint((char **)0x0,
                       (sqlite3_int64 *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0x1c200d);
    fts3ReadNextPos(pp_00,(sqlite3_int64 *)
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    fts3ReadNextPos(pp_00,(sqlite3_int64 *)
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    in_stack_ffffffffffffff9c = CONCAT13(1,(int3)in_stack_ffffffffffffff9c);
  } while( true );
}

Assistant:

static void fts3PoslistMerge(
  char **pp,                      /* Output buffer */
  char **pp1,                     /* Left input list */
  char **pp2                      /* Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;

  while( *p1 || *p2 ){
    int iCol1;         /* The current column index in pp1 */
    int iCol2;         /* The current column index in pp2 */

    if( *p1==POS_COLUMN ) fts3GetVarint32(&p1[1], &iCol1);
    else if( *p1==POS_END ) iCol1 = POSITION_LIST_END;
    else iCol1 = 0;

    if( *p2==POS_COLUMN ) fts3GetVarint32(&p2[1], &iCol2);
    else if( *p2==POS_END ) iCol2 = POSITION_LIST_END;
    else iCol2 = 0;

    if( iCol1==iCol2 ){
      sqlite3_int64 i1 = 0;       /* Last position from pp1 */
      sqlite3_int64 i2 = 0;       /* Last position from pp2 */
      sqlite3_int64 iPrev = 0;
      int n = fts3PutColNumber(&p, iCol1);
      p1 += n;
      p2 += n;

      /* At this point, both p1 and p2 point to the start of column-lists
      ** for the same column (the column with index iCol1 and iCol2).
      ** A column-list is a list of non-negative delta-encoded varints, each 
      ** incremented by 2 before being stored. Each list is terminated by a
      ** POS_END (0) or POS_COLUMN (1). The following block merges the two lists
      ** and writes the results to buffer p. p is left pointing to the byte
      ** after the list written. No terminator (POS_END or POS_COLUMN) is
      ** written to the output.
      */
      fts3GetDeltaVarint(&p1, &i1);
      fts3GetDeltaVarint(&p2, &i2);
      do {
        fts3PutDeltaVarint(&p, &iPrev, (i1<i2) ? i1 : i2); 
        iPrev -= 2;
        if( i1==i2 ){
          fts3ReadNextPos(&p1, &i1);
          fts3ReadNextPos(&p2, &i2);
        }else if( i1<i2 ){
          fts3ReadNextPos(&p1, &i1);
        }else{
          fts3ReadNextPos(&p2, &i2);
        }
      }while( i1!=POSITION_LIST_END || i2!=POSITION_LIST_END );
    }else if( iCol1<iCol2 ){
      p1 += fts3PutColNumber(&p, iCol1);
      fts3ColumnlistCopy(&p, &p1);
    }else{
      p2 += fts3PutColNumber(&p, iCol2);
      fts3ColumnlistCopy(&p, &p2);
    }
  }

  *p++ = POS_END;
  *pp = p;
  *pp1 = p1 + 1;
  *pp2 = p2 + 1;
}